

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RefCountedObject.h
# Opt level: O2

RefCountedPtr<soul::SourceCodeText> * __thiscall
soul::RefCountedPtr<soul::SourceCodeText>::operator=
          (RefCountedPtr<soul::SourceCodeText> *this,RefCountedPtr<soul::SourceCodeText> *other)

{
  SourceCodeText *o;
  
  o = this->object;
  if (other->object != o) {
    this->object = other->object;
    other->object = (SourceCodeText *)0x0;
    decIfNotNull(o);
  }
  return this;
}

Assistant:

RefCountedPtr& operator= (RefCountedPtr&& other)
    {
        if (other.object != object)
        {
            auto oldObject = object;
            object = other.object;
            other.object = nullptr;
            decIfNotNull (oldObject);
        }

        return *this;
    }